

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

void stbiw__write_pixel(stbi__write_context *s,int rgb_dir,int comp,int write_alpha,int expand_mono,
                       uchar *d)

{
  uchar uVar1;
  uchar uVar2;
  undefined1 (*pauVar3) [16];
  int iVar4;
  undefined4 in_register_00000084;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  uchar px [3];
  uchar local_37;
  uchar uStack_36;
  uchar uStack_35;
  
  pauVar3 = (undefined1 (*) [16])CONCAT44(in_register_00000084,expand_mono);
  if (rgb_dir - 1U < 2) {
    local_37 = (*pauVar3)[0];
    iVar4 = s->buf_used;
    if (write_alpha != 0) {
      if (0x3d < iVar4) {
        (*s->func)(s->context,s->buffer,iVar4);
        iVar4 = 0;
      }
      s->buf_used = iVar4 + 3;
      s->buffer[iVar4] = local_37;
      s->buffer[(long)iVar4 + 1] = local_37;
      goto LAB_0028f95b;
    }
    if (0x3f < iVar4) {
      (*s->func)(s->context,s->buffer,iVar4);
      iVar4 = 0;
    }
    s->buf_used = iVar4 + 1;
  }
  else {
    if (rgb_dir != 3) {
      if (rgb_dir != 4) goto LAB_0028f966;
      if (comp == 0) {
        auVar6 = vpbroadcastd_avx512f(ZEXT416(0x80808081));
        auVar7 = vpbroadcastd_avx512f();
        auVar5 = vmovdqu8_avx512vl(*pauVar3);
        auVar8 = vpmovzxbd_avx512f(ZEXT316(auVar5._0_3_));
        auVar8 = vpaddd_avx512f(auVar8,_DAT_00458d40);
        auVar7 = vpmulld_avx512f(auVar8,auVar7);
        auVar8 = vpshufd_avx512f(auVar7,0xf5);
        auVar9 = vpmuldq_avx512f(auVar7,auVar6);
        auVar6 = vpmuldq_avx512f(auVar8,auVar6);
        auVar8 = vpmovsxbd_avx512f(_DAT_0045ad20);
        auVar6 = vpermi2d_avx512f(auVar8,auVar9,auVar6);
        auVar6 = vpaddd_avx512f(auVar6,auVar7);
        auVar7 = vpsrld_avx512f(auVar6,0x1f);
        auVar6 = vpsrld_avx512f(auVar6,7);
        auVar6 = vpaddd_avx512f(auVar6,auVar7);
        auVar5 = vpmovdb_avx512f(auVar6);
        auVar5 = vpaddb_avx(auVar5,_DAT_0045ad90);
        auVar5 = vmovdqu8_avx512vl(auVar5);
        local_37 = auVar5[0];
        uStack_36 = auVar5[1];
        uStack_35 = auVar5[2];
        iVar4 = s->buf_used;
        if (0x3d < iVar4) {
          (*s->func)(s->context,s->buffer,iVar4);
          iVar4 = 0;
        }
        s->buf_used = iVar4 + 3;
        s->buffer[iVar4] = uStack_35;
        s->buffer[(long)iVar4 + 1] = uStack_36;
        goto LAB_0028f95b;
      }
    }
    uVar1 = (*pauVar3)[2];
    local_37 = (*pauVar3)[0];
    uVar2 = (*pauVar3)[1];
    iVar4 = s->buf_used;
    if (0x3d < iVar4) {
      (*s->func)(s->context,s->buffer,iVar4);
      iVar4 = 0;
    }
    s->buf_used = iVar4 + 3;
    s->buffer[iVar4] = uVar1;
    s->buffer[(long)iVar4 + 1] = uVar2;
LAB_0028f95b:
    iVar4 = iVar4 + 2;
  }
  s->buffer[iVar4] = local_37;
LAB_0028f966:
  if (0 < comp) {
    iVar4 = s->buf_used;
    uVar1 = pauVar3[-1][(long)rgb_dir + 0xf];
    if (0x3f < iVar4) {
      (*s->func)(s->context,s->buffer,iVar4);
      iVar4 = 0;
    }
    s->buf_used = iVar4 + 1;
    s->buffer[iVar4] = uVar1;
  }
  return;
}

Assistant:

static void stbiw__write_pixel(stbi__write_context *s, int rgb_dir, int comp, int write_alpha, int expand_mono, unsigned char *d)
{
   unsigned char bg[3] = { 255, 0, 255}, px[3];
   int k;

   if (write_alpha < 0)
      stbiw__write1(s, d[comp - 1]);

   switch (comp) {
      case 2: // 2 pixels = mono + alpha, alpha is written separately, so same as 1-channel case
      case 1:
         if (expand_mono)
            stbiw__write3(s, d[0], d[0], d[0]); // monochrome bmp
         else
            stbiw__write1(s, d[0]);  // monochrome TGA
         break;
      case 4:
         if (!write_alpha) {
            // composite against pink background
            for (k = 0; k < 3; ++k)
               px[k] = bg[k] + ((d[k] - bg[k]) * d[3]) / 255;
            stbiw__write3(s, px[1 - rgb_dir], px[1], px[1 + rgb_dir]);
            break;
         }
         /* FALLTHROUGH */
      case 3:
         stbiw__write3(s, d[1 - rgb_dir], d[1], d[1 + rgb_dir]);
         break;
   }
   if (write_alpha > 0)
      stbiw__write1(s, d[comp - 1]);
}